

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printLevelMode(LevelMode lm)

{
  ostream *this;
  char *pcVar1;
  
  if (lm == RIPMAP_LEVELS) {
    pcVar1 = "rip-map";
  }
  else if (lm == MIPMAP_LEVELS) {
    pcVar1 = "mip-map";
  }
  else {
    if (lm != ONE_LEVEL) {
      this = std::operator<<((ostream *)&std::cout,"level mode ");
      std::ostream::operator<<(this,lm);
      return;
    }
    pcVar1 = "single level";
  }
  std::operator<<((ostream *)&std::cout,pcVar1);
  return;
}

Assistant:

void
printLevelMode (LevelMode lm)
{
    switch (lm)
    {
        case ONE_LEVEL: cout << "single level"; break;

        case MIPMAP_LEVELS: cout << "mip-map"; break;

        case RIPMAP_LEVELS: cout << "rip-map"; break;

        default: cout << "level mode " << int (lm); break;
    }
}